

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O1

void __thiscall FormatTest_ToString_Test::TestBody(FormatTest_ToString_Test *this)

{
  bool bVar1;
  void **value;
  char *pcVar2;
  AssertionResult gtest_ar;
  AssertHelper local_48;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  string local_30;
  
  local_48.data_._0_4_ = 0x2a;
  fmt::v5::to_string<int>(&local_30,(int *)&local_48);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_40,"\"42\"","fmt::to_string(42)",(char (*) [3])0x248e7f,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x7ee,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_30._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
      }
      local_30._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.data_ = (AssertHelperData *)0x1234;
  fmt::v5::to_string<void*>(&local_30,(v5 *)&local_48,value);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            (local_40,"\"0x1234\"","fmt::to_string(reinterpret_cast<void*>(0x1234))",
             (char (*) [7])"0x1234",&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x7ef,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_30._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
      }
      local_30._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FormatTest, ToString) {
  EXPECT_EQ("42", fmt::to_string(42));
  EXPECT_EQ("0x1234", fmt::to_string(reinterpret_cast<void*>(0x1234)));
}